

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_type_demo.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\n------------- value type graph -------------\n")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  ValueTypeGraphDemo();
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\n------------- pointer type graph -------------\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  PointerTypeGraphDemo();
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\n------------- shared pointer type graph -------------\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  std::cout << "\n------------- value type graph -------------\n" << std::endl;
  ValueTypeGraphDemo();

  std::cout << "\n------------- pointer type graph -------------\n"
            << std::endl;
  PointerTypeGraphDemo();

  std::cout << "\n------------- shared pointer type graph -------------\n"
            << std::endl;
  //   SharedPtrTypeGraphDemo();

  return 0;
}